

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O3

void __thiscall xLearn::MODEL_TEST_Init_ffm_Test::TestBody(MODEL_TEST_Init_ffm_Test *this)

{
  real_t *prVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  AssertionResult gtest_ar;
  index_t param_num_v;
  index_t param_num_w;
  Model model_ffm;
  HyperParam hyper_param;
  Message local_338;
  AssertHelper local_330;
  internal local_328 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  uint local_314;
  ulong local_310;
  uint local_304;
  real_t *local_300;
  long local_2f8;
  long local_2f0;
  ulong local_2e8;
  uint local_2dc;
  real_t *local_2d8;
  Model local_2d0;
  HyperParam local_240;
  
  Init();
  local_2d0.score_func_._M_dataplus._M_p = (pointer)&local_2d0.score_func_.field_2;
  local_2d0.score_func_._M_string_length = 0;
  local_2d0.score_func_.field_2._M_local_buf[0] = '\0';
  local_2d0.loss_func_._M_dataplus._M_p = (pointer)&local_2d0.loss_func_.field_2;
  local_2d0.loss_func_._M_string_length = 0;
  local_2d0.loss_func_.field_2._M_local_buf[0] = '\0';
  local_2d0.param_w_ = (real_t *)0x0;
  local_2d0.param_v_ = (real_t *)0x0;
  local_2d0.param_b_ = (float *)0x0;
  local_2d0.param_best_w_ = (real_t *)0x0;
  local_2d0.param_best_v_ = (real_t *)0x0;
  local_2d0.param_best_b_ = (real_t *)0x0;
  Model::Initialize(&local_2d0,&local_240.score_func,&local_240.loss_func,local_240.num_feature,
                    local_240.num_field,local_240.num_K,local_240.auxiliary_size,1.0);
  prVar1 = local_2d0.param_b_;
  local_2dc = local_240.num_feature * 2;
  local_300 = local_2d0.param_w_;
  local_2d8 = local_2d0.param_v_;
  local_304 = local_2dc * local_240.num_field * local_240.num_K;
  local_338.ss_.ptr_._0_4_ = local_2d0.param_num_w_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_328,"param_num_w","model_ffm.GetNumParameter_w()",&local_2dc,(uint *)&local_338);
  if (local_328[0] == (internal)0x0) {
    testing::Message::Message(&local_338);
    if (local_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x3c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_330,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338.ss_.ptr_._0_4_ = local_2d0.param_num_v_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_328,"param_num_v","model_ffm.GetNumParameter_v()",&local_304,(uint *)&local_338);
  if (local_328[0] == (internal)0x0) {
    testing::Message::Message(&local_338);
    if (local_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x3d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_330,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338.ss_.ptr_._0_4_ = local_304 + 2 + local_2dc;
  local_330.data_._0_4_ = local_2d0.param_num_w_ + 2 + local_2d0.param_num_v_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_328,"param_num_v+param_num_w+2","model_ffm.GetNumParameter()",(uint *)&local_338,
             (uint *)&local_330);
  if (local_328[0] == (internal)0x0) {
    testing::Message::Message(&local_338);
    if (local_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x3e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_330,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<float>(local_328,"b[0]","0",*prVar1,0.0);
  if (local_328[0] == (internal)0x0) {
    testing::Message::Message(&local_338);
    if (local_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x3f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_330,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<float>(local_328,"b[1]","1.0",prVar1[1],1.0);
  if (local_328[0] == (internal)0x0) {
    testing::Message::Message(&local_338);
    if (local_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x40,pcVar4);
    testing::internal::AssertHelper::operator=(&local_330,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    if (CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_310 = (ulong)local_240.auxiliary_size;
  local_2f0 = CONCAT44(local_2f0._4_4_,local_2d0.param_num_w_);
  if (local_2d0.param_num_w_ != 0) {
    uVar3 = 1;
    uVar6 = 0;
    local_2f8 = local_310 - 1;
    do {
      testing::internal::CmpHelperFloatingPointEQ<float>
                (local_328,"w[i]","0.0",local_300[uVar6],0.0);
      if (local_328[0] == (internal)0x0) {
        testing::Message::Message(&local_338);
        pcVar4 = "";
        if (local_320.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_330,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                   ,0x44,pcVar4);
        testing::internal::AssertHelper::operator=(&local_330,&local_338);
        testing::internal::AssertHelper::~AssertHelper(&local_330);
        if (CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) != (long *)0x0)
             ) {
            (**(code **)(*(long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) + 8
                        ))();
          }
        }
      }
      local_2e8 = uVar6;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar7 = local_2f8;
      local_314 = uVar3;
      if (1 < (uint)local_310) {
        do {
          testing::internal::CmpHelperFloatingPointEQ<float>
                    (local_328,"w[i+j]","1.0",local_300[uVar3],1.0);
          if (local_328[0] == (internal)0x0) {
            testing::Message::Message(&local_338);
            pcVar4 = "";
            if (local_320.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_330,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                       ,0x46,pcVar4);
            testing::internal::AssertHelper::operator=(&local_330,&local_338);
            testing::internal::AssertHelper::~AssertHelper(&local_330);
            if (CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) != 0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 ((long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) !=
                  (long *)0x0)) {
                (**(code **)(*(long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_)
                            + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_320,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          uVar3 = uVar3 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      uVar5 = (int)local_2e8 + (int)local_310;
      uVar6 = (ulong)uVar5;
      uVar3 = local_314 + (int)local_310;
    } while (uVar5 < (uint)local_2f0);
  }
  local_314 = local_2d0.param_num_v_;
  if (local_2d0.param_num_v_ != 0) {
    uVar5 = 4;
    local_2f0 = local_310 - 1;
    local_2f8 = CONCAT44(local_2f8._4_4_,(int)local_310 * 4);
    uVar3 = 0;
    do {
      local_300 = (real_t *)(ulong)uVar3;
      local_2e8 = CONCAT44(local_2e8._4_4_,uVar5);
      lVar7 = local_2f0;
      if (1 < (uint)local_310) {
        do {
          testing::internal::CmpHelperFloatingPointEQ<float>
                    (local_328,"v[i+kAlign*j]","1.0",local_2d8[uVar5],1.0);
          if (local_328[0] == (internal)0x0) {
            testing::Message::Message(&local_338);
            pcVar4 = "";
            if (local_320.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_330,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                       ,0x4d,pcVar4);
            testing::internal::AssertHelper::operator=(&local_330,&local_338);
            testing::internal::AssertHelper::~AssertHelper(&local_330);
            if (CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) != 0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 ((long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_) !=
                  (long *)0x0)) {
                (**(code **)(*(long *)CONCAT44(local_338.ss_.ptr_._4_4_,(index_t)local_338.ss_.ptr_)
                            + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_320,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          uVar5 = uVar5 + 4;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      uVar3 = (int)local_300 + (int)local_2f8;
      uVar5 = (int)local_2e8 + (int)local_2f8;
    } while (uVar3 < local_314);
  }
  Model::~Model(&local_2d0);
  HyperParam::~HyperParam(&local_240);
  return;
}

Assistant:

TEST(MODEL_TEST, Init_ffm) {
  HyperParam hyper_param = Init();
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size);
  real_t* b = model_ffm.GetParameter_b();
  real_t* w = model_ffm.GetParameter_w();
  index_t param_num_w = hyper_param.num_feature * 2;
  real_t* v = model_ffm.GetParameter_v();
  index_t param_num_v = hyper_param.num_feature *
                      hyper_param.num_field *
                      hyper_param.num_K * 2;
  EXPECT_EQ(param_num_w, model_ffm.GetNumParameter_w());
  EXPECT_EQ(param_num_v, model_ffm.GetNumParameter_v());
  EXPECT_EQ(param_num_v+param_num_w+2, model_ffm.GetNumParameter());
  EXPECT_FLOAT_EQ(b[0], 0);
  EXPECT_FLOAT_EQ(b[1], 1.0);
  index_t len = model_ffm.GetNumParameter_w();
  index_t aux_size = hyper_param.auxiliary_size;
  for (index_t i = 0; i < len; i += aux_size) {
    EXPECT_FLOAT_EQ(w[i], 0.0);
    for (index_t j = 1; j < aux_size; ++j) {
      EXPECT_FLOAT_EQ(w[i+j], 1.0);
    }

  }
  len = model_ffm.GetNumParameter_v();
  for (index_t i = 0; i < len; i+=(kAlign*aux_size)) {
    for (index_t j = 1; j < aux_size; ++j) {
      EXPECT_FLOAT_EQ(v[i+kAlign*j], 1.0);
    }
  }
}